

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O2

void __thiscall bignum_t<32>::set(bignum_t<32> *this,vm_val_t *val)

{
  uint uVar1;
  int iVar2;
  double val_00;
  
  if (val->typ == VM_OBJ) {
    uVar1 = (val->val).obj & 0xfff;
    iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc][uVar1].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + uVar1,
                       CVmObjBigNum::metaclass_reg_);
    if (iVar2 != 0) {
      if (G_obj_table_X.pages_[(val->val).obj >> 0xc] != (CVmObjPageEntry *)0x0) {
        CVmObjBigNum::copy_val
                  (this->ext,
                   *(char **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8),1);
        return;
      }
    }
  }
  else if (val->typ == VM_INT) {
    CVmObjBigNum::set_int_val(this->ext,(long)(val->val).intval);
    return;
  }
  iVar2 = vm_val_t::is_numeric(val);
  if (iVar2 != 0) {
    val_00 = vm_val_t::num_to_double(val);
    CVmObjBigNum::set_double_val(this->ext,val_00);
    return;
  }
  err_throw(0x7d4);
}

Assistant:

void set(VMG_ const vm_val_t *val)
    {
        CVmObjBigNum *b;
        if (val->typ == VM_INT)
            CVmObjBigNum::set_int_val(ext, val->val.intval);
        else if ((b = vm_val_cast(CVmObjBigNum, val)) != 0)
            CVmObjBigNum::copy_val(ext, b->get_ext(), TRUE);
        else if (val->is_numeric(vmg0_))
            CVmObjBigNum::set_double_val(ext, val->num_to_double(vmg0_));
        else
            err_throw(VMERR_NUM_VAL_REQD);
    }